

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# derived_properties.c
# Opt level: O0

void release_derived_properties(derived_properties_t *dp)

{
  ulong local_18;
  size_t i;
  derived_properties_t *dp_local;
  
  for (local_18 = 0; local_18 < dp->count; local_18 = local_18 + 1) {
    free(dp->name[local_18]);
  }
  free(dp->name);
  free(dp->begin);
  free(dp->end);
  free(dp->code_points);
  free(dp);
  return;
}

Assistant:

void release_derived_properties( struct derived_properties_t * dp )
{
    size_t i;

    for ( i = 0; i < dp->count; ++i )
    {
        free( dp->name[ i ] );
    }

    free( dp->name );
    free( dp->begin );
    free( dp->end );
    free( dp->code_points );
    free( dp );
}